

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_keypair_create(secp256k1_context *ctx,secp256k1_keypair *keypair,uchar *seckey32)

{
  int iVar1;
  secp256k1_ge *in_RDX;
  secp256k1_scalar *in_RSI;
  secp256k1_ecmult_gen_context *in_RDI;
  int ret;
  secp256k1_ge pk;
  secp256k1_scalar sk;
  secp256k1_scalar *in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff60;
  undefined4 uVar2;
  uchar *in_stack_ffffffffffffffd8;
  int local_4;
  
  uVar2 = 0;
  if (in_RSI == (secp256k1_scalar *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)(ulong)in_stack_ffffffffffffff60,
               (char *)in_stack_ffffffffffffff58);
    local_4 = 0;
  }
  else {
    memset(in_RSI,0,0x60);
    iVar1 = secp256k1_ecmult_gen_context_is_built(in_RDI);
    if (iVar1 == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT44(uVar2,in_stack_ffffffffffffff60),
                 (char *)in_stack_ffffffffffffff58);
      local_4 = 0;
    }
    else if (in_RDX == (secp256k1_ge *)0x0) {
      secp256k1_callback_call
                ((secp256k1_callback *)CONCAT44(uVar2,in_stack_ffffffffffffff60),
                 (char *)in_stack_ffffffffffffff58);
      local_4 = 0;
    }
    else {
      local_4 = secp256k1_ec_pubkey_create_helper(in_RDI,in_RSI,in_RDX,in_stack_ffffffffffffffd8);
      secp256k1_keypair_save
                ((secp256k1_keypair *)CONCAT44(local_4,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58,(secp256k1_ge *)0x108ac5);
      secp256k1_memczero(in_RSI,0x60,(uint)((local_4 != 0 ^ 0xffU) & 1));
      secp256k1_scalar_clear((secp256k1_scalar *)&stack0xffffffffffffffc0);
    }
  }
  return local_4;
}

Assistant:

int secp256k1_keypair_create(const secp256k1_context* ctx, secp256k1_keypair *keypair, const unsigned char *seckey32) {
    secp256k1_scalar sk;
    secp256k1_ge pk;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(keypair != NULL);
    memset(keypair, 0, sizeof(*keypair));
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(seckey32 != NULL);

    ret = secp256k1_ec_pubkey_create_helper(&ctx->ecmult_gen_ctx, &sk, &pk, seckey32);
    secp256k1_keypair_save(keypair, &sk, &pk);
    secp256k1_memczero(keypair, sizeof(*keypair), !ret);

    secp256k1_scalar_clear(&sk);
    return ret;
}